

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O2

int ARKodeSetMaxStep(void *arkode_mem,sunrealtype hmax)

{
  int line;
  int error_code;
  char *msgfmt;
  
  if (arkode_mem == (void *)0x0) {
    msgfmt = "arkode_mem = NULL illegal.";
    arkode_mem = (ARKodeMem)0x0;
    error_code = -0x15;
    line = 0x489;
  }
  else {
    if (*(int *)((long)arkode_mem + 0x100) != 0) {
      if (hmax <= 0.0) {
        *(undefined8 *)((long)arkode_mem + 0x2d0) = 0;
      }
      else {
        if (1.0 < *(double *)((long)arkode_mem + 0x2c8) * (1.0 / hmax)) {
          msgfmt = "Inconsistent step size limits: hmin > hmax.";
          error_code = -0x16;
          line = 0x4a2;
          goto LAB_0013b5d4;
        }
        *(double *)((long)arkode_mem + 0x2d0) = 1.0 / hmax;
      }
      return 0;
    }
    msgfmt = "time-stepping module does not support temporal adaptivity";
    error_code = -0x30;
    line = 0x492;
  }
LAB_0013b5d4:
  arkProcessError((ARKodeMem)arkode_mem,error_code,line,"ARKodeSetMaxStep",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_io.c"
                  ,msgfmt);
  return error_code;
}

Assistant:

int ARKodeSetMaxStep(void* arkode_mem, sunrealtype hmax)
{
  sunrealtype hmax_inv;
  ARKodeMem ark_mem;
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;

  /* Guard against use for non-adaptive time stepper modules */
  if (!ark_mem->step_supports_adaptive)
  {
    arkProcessError(ark_mem, ARK_STEPPER_UNSUPPORTED, __LINE__, __func__,
                    __FILE__, "time-stepping module does not support temporal adaptivity");
    return (ARK_STEPPER_UNSUPPORTED);
  }

  /* Passing a value <= 0 sets hmax = infinity */
  if (hmax <= ZERO)
  {
    ark_mem->hmax_inv = ZERO;
    return (ARK_SUCCESS);
  }

  /* check that hmax and hmin are agreeable */
  hmax_inv = ONE / hmax;
  if (hmax_inv * ark_mem->hmin > ONE)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_ARK_BAD_HMIN_HMAX);
    return (ARK_ILL_INPUT);
  }

  /* set the value */
  ark_mem->hmax_inv = hmax_inv;

  return (ARK_SUCCESS);
}